

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess.cpp
# Opt level: O3

void __thiscall
QProcessEnvironmentPrivate::insert
          (QProcessEnvironmentPrivate *this,QProcessEnvironmentPrivate *other)

{
  QMutex *pQVar1;
  QMapData<std::map<QByteArray,_QProcEnvValue,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QProcEnvValue>_>_>_>
  *pQVar2;
  Entry *pEVar3;
  _Base_ptr p_Var4;
  ulong uVar5;
  _Base_ptr p_Var6;
  Data *pDVar7;
  ulong uVar8;
  long in_FS_OFFSET;
  QOrderedMutexLocker local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (other->vars).d.d.ptr;
  if (pQVar2 == (QMapData<std::map<QByteArray,_QProcEnvValue,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QProcEnvValue>_>_>_>
                 *)0x0) {
    p_Var4 = (_Base_ptr)0x0;
  }
  else {
    p_Var4 = *(_Base_ptr *)((long)&(pQVar2->m)._M_t._M_impl.super__Rb_tree_header._M_header + 0x10);
  }
  p_Var6 = &(pQVar2->m)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (pQVar2 == (QMapData<std::map<QByteArray,_QProcEnvValue,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QProcEnvValue>_>_>_>
                 *)0x0) {
    p_Var6 = (_Base_ptr)0x0;
  }
  if (p_Var4 != p_Var6) {
    do {
      QMap<QByteArray,_QProcEnvValue>::insert
                (&this->vars,(QByteArray *)(p_Var4 + 1),(QProcEnvValue *)&p_Var4[1]._M_right);
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    } while (p_Var4 != p_Var6);
  }
  local_48.mtx2 = &(this->nameMapMutex).super_QBasicMutex;
  pQVar1 = &other->nameMapMutex;
  local_48.mtx1 = local_48.mtx2;
  if (local_48.mtx2 >= pQVar1 && local_48.mtx2 != &pQVar1->super_QBasicMutex) {
    local_48.mtx1 = &pQVar1->super_QBasicMutex;
  }
  if (local_48.mtx2 < pQVar1) {
    local_48.mtx2 = &pQVar1->super_QBasicMutex;
  }
  if (this == other) {
    local_48.mtx2 = &((QMutex *)0x0)->super_QBasicMutex;
  }
  local_48.locked = false;
  local_48._17_7_ = 0xaaaaaaaaaaaaaa;
  QOrderedMutexLocker::relock(&local_48);
  pDVar7 = (other->nameMap).d;
  if (pDVar7 == (Data *)0x0) {
LAB_0041b54a:
    uVar8 = 0;
    pDVar7 = (Data *)0x0;
LAB_0041b54d:
    if (pDVar7 == (Data *)0x0 && uVar8 == 0) goto LAB_0041b5e5;
  }
  else {
    if (pDVar7->spans->offsets[0] == 0xff) {
      uVar5 = 1;
      do {
        uVar8 = uVar5;
        if (pDVar7->numBuckets == uVar8) goto LAB_0041b54a;
        uVar5 = uVar8 + 1;
      } while (pDVar7->spans[uVar8 >> 7].offsets[(uint)uVar8 & 0x7f] == 0xff);
      goto LAB_0041b54d;
    }
    uVar8 = 0;
  }
  do {
    pEVar3 = pDVar7->spans[uVar8 >> 7].entries;
    uVar5 = (ulong)((uint)pDVar7->spans[uVar8 >> 7].offsets[(uint)uVar8 & 0x7f] * 0x30);
    QHash<QString,QByteArray>::emplace<QByteArray_const&>
              ((QHash<QString,QByteArray> *)&this->nameMap,
               (QString *)((pEVar3->storage).data + uVar5),
               (QByteArray *)((pEVar3->storage).data + uVar5 + 0x18));
    do {
      if (pDVar7->numBuckets - 1 == uVar8) {
        pDVar7 = (Data *)0x0;
        uVar8 = 0;
        break;
      }
      uVar8 = uVar8 + 1;
    } while (pDVar7->spans[uVar8 >> 7].offsets[(uint)uVar8 & 0x7f] == 0xff);
  } while ((pDVar7 != (Data *)0x0) || (uVar8 != 0));
LAB_0041b5e5:
  QOrderedMutexLocker::unlock(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QProcessEnvironmentPrivate::insert(const QProcessEnvironmentPrivate &other)
{
    auto it = other.vars.constBegin();
    const auto end = other.vars.constEnd();
    for ( ; it != end; ++it)
        vars.insert(it.key(), it.value());

#ifdef Q_OS_UNIX
    const OrderedNameMapMutexLocker locker(this, &other);
    auto nit = other.nameMap.constBegin();
    const auto nend = other.nameMap.constEnd();
    for ( ; nit != nend; ++nit)
        nameMap.insert(nit.key(), nit.value());
#endif
}